

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void lodepng_state_copy(LodePNGState *dest,LodePNGState *source)

{
  uint uVar1;
  LodePNGState *source_local;
  LodePNGState *dest_local;
  
  lodepng_state_cleanup(dest);
  memcpy(dest,source,0x220);
  lodepng_color_mode_init(&dest->info_raw);
  lodepng_info_init(&dest->info_png);
  uVar1 = lodepng_color_mode_copy(&dest->info_raw,&source->info_raw);
  dest->error = uVar1;
  if (dest->error == 0) {
    uVar1 = lodepng_info_copy(&dest->info_png,&source->info_png);
    dest->error = uVar1;
  }
  return;
}

Assistant:

void lodepng_state_copy(LodePNGState* dest, const LodePNGState* source) {
  lodepng_state_cleanup(dest);
  *dest = *source;
  lodepng_color_mode_init(&dest->info_raw);
  lodepng_info_init(&dest->info_png);
  dest->error = lodepng_color_mode_copy(&dest->info_raw, &source->info_raw); if(dest->error) return;
  dest->error = lodepng_info_copy(&dest->info_png, &source->info_png); if(dest->error) return;
}